

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O0

void grpc_java_generator::anon_unknown_0::PrintStub
               (Printer *p,VARS *vars,ServiceDescriptor *service,StubType type)

{
  int iVar1;
  uint uVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  pointer pMVar5;
  _anonymous_namespace_ *p_Var6;
  type method_00;
  char *pcVar7;
  MethodDescriptor *method_01;
  MethodDescriptor *method_02;
  byte local_6d4;
  byte local_6d1;
  allocator<char> local_569;
  key_type local_568;
  allocator<char> local_541;
  key_type local_540;
  byte local_519;
  LogHelper local_518;
  LogMessageVoidify local_50a;
  allocator<char> local_509;
  key_type local_508;
  allocator<char> local_4e1;
  key_type local_4e0;
  allocator<char> local_4b9;
  key_type local_4b8;
  allocator<char> local_491;
  key_type local_490;
  allocator<char> local_469;
  key_type local_468;
  allocator<char> local_441;
  key_type local_440;
  allocator<char> local_419;
  key_type local_418;
  allocator<char> local_3f1;
  key_type local_3f0;
  allocator<char> local_3c9;
  key_type local_3c8;
  allocator<char> local_3a1;
  key_type local_3a0;
  allocator<char> local_379;
  key_type local_378;
  allocator<char> local_351;
  key_type local_350;
  allocator<char> local_329;
  key_type local_328;
  byte local_301;
  LogHelper local_300;
  LogMessageVoidify local_2f2;
  byte local_2f1;
  LogHelper local_2f0;
  LogMessageVoidify local_2e2;
  byte local_2e1;
  LogHelper local_2e0;
  LogMessageVoidify local_2d1;
  undefined4 local_2d0;
  byte local_2cb;
  byte local_2ca;
  allocator<char> local_2c9;
  undefined1 local_2c8 [5];
  bool server_streaming;
  bool client_streaming;
  string local_2a8;
  allocator<char> local_281;
  key_type local_280;
  string local_260;
  allocator<char> local_239;
  key_type local_238;
  string local_218;
  string local_1f8;
  allocator<char> local_1d1;
  key_type local_1d0;
  string local_1b0;
  string local_190;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  local_170;
  unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
  method;
  int i;
  allocator<char> local_139;
  key_type local_138;
  LogHelper local_118;
  LogMessageVoidify local_10f;
  byte local_10e;
  byte local_10d;
  int local_10c;
  string local_108 [2];
  bool interface;
  bool impl_base;
  CallType call_type;
  string client_name;
  string stub_name;
  key_type local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_69;
  key_type local_68;
  undefined1 local_48 [8];
  string service_name;
  StubType type_local;
  ServiceDescriptor *service_local;
  VARS *vars_local;
  Printer *p_local;
  
  service_name.field_2._12_4_ = type;
  (*(service->super_CommentHolder)._vptr_CommentHolder[6])(local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"service_name",&local_69);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_68);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::operator+(&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "ImplBase");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"abstract_name",
             (allocator<char> *)(stub_name.field_2._M_local_buf + 0xf));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(stub_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)(client_name.field_2._M_local_buf + 8),(string *)local_48);
  std::__cxx11::string::string(local_108,(string *)local_48);
  local_10c = 0;
  local_10d = 0;
  local_10e = 0;
  switch(service_name.field_2._12_4_) {
  case 0:
    local_10c = 0;
    local_10e = 1;
    break;
  case 1:
    local_10e = 1;
  case 5:
    local_10c = 1;
    std::__cxx11::string::operator+=
              ((string *)(client_name.field_2._M_local_buf + 8),"BlockingStub");
    std::__cxx11::string::operator+=(local_108,"BlockingClient");
    break;
  case 2:
    local_10e = 1;
  case 6:
    local_10c = 2;
    std::__cxx11::string::operator+=((string *)(client_name.field_2._M_local_buf + 8),"FutureStub");
    std::__cxx11::string::operator+=(local_108,"FutureClient");
    break;
  default:
    LogMessageVoidify::LogMessageVoidify(&local_10f);
    LogHelper::LogHelper(&local_118,(ostream *)&std::cerr);
    poVar4 = LogHelper::get_os(&local_118);
    poVar4 = std::operator<<(poVar4,"CHECK FAILED: ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/grpc/src/compiler/java_generator.cc"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1ea);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Cannot determine class name for StubType: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,service_name.field_2._12_4_);
    LogMessageVoidify::operator&(&local_10f,poVar4);
    LogHelper::~LogHelper(&local_118);
    break;
  case 4:
    local_10c = 0;
    std::__cxx11::string::operator+=((string *)(client_name.field_2._M_local_buf + 8),"Stub");
    break;
  case 7:
    local_10c = 0;
    local_10d = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"stub_name",&local_139);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_138);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)(client_name.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"client_name",
             (allocator<char> *)
             ((long)&method._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,(key_type *)&i);
  std::__cxx11::string::operator=((string *)pmVar3,local_108);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&method._M_t.
                     super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                     .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 7)
            );
  if ((local_10e & 1) == 0) {
    GrpcWriteServiceDocComment(p,vars,service);
  }
  if ((local_10d & 1) == 0) {
    (*p->_vptr_Printer[2])
              (p,vars,
               "public static final class $stub_name$ extends $AbstractStub$<$stub_name$> {\n");
  }
  else {
    (*p->_vptr_Printer[2])
              (p,vars,
               "public static abstract class $abstract_name$ implements $BindableService$ {\n");
  }
  (*p->_vptr_Printer[5])();
  if (((local_10d & 1) == 0) && ((local_10e & 1) == 0)) {
    (*p->_vptr_Printer[2])(p,vars,"private $stub_name$($Channel$ channel) {\n");
    (*p->_vptr_Printer[5])();
    (*p->_vptr_Printer[3])(p,"super(channel);\n");
    (*p->_vptr_Printer[6])();
    (*p->_vptr_Printer[3])(p,"}\n\n");
    (*p->_vptr_Printer[2])
              (p,vars,"private $stub_name$($Channel$ channel,\n    $CallOptions$ callOptions) {\n");
    (*p->_vptr_Printer[5])();
    (*p->_vptr_Printer[3])(p,"super(channel, callOptions);\n");
    (*p->_vptr_Printer[6])();
    (*p->_vptr_Printer[3])(p,"}\n\n");
    (*p->_vptr_Printer[2])
              (p,vars,
               "@$Override$\nprotected $stub_name$ build($Channel$ channel,\n    $CallOptions$ callOptions) {\n"
              );
    (*p->_vptr_Printer[5])();
    (*p->_vptr_Printer[2])(p,vars,"return new $stub_name$(channel, callOptions);\n");
    (*p->_vptr_Printer[6])();
    (*p->_vptr_Printer[3])(p,"}\n");
  }
  for (method._M_t.
       super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
       .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ = 0;
      uVar2 = (uint)method._M_t.
                    super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                    .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl,
      iVar1 = (*(service->super_CommentHolder)._vptr_CommentHolder[8])(), (int)uVar2 < iVar1;
      method._M_t.
      super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
      .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl._0_4_ =
           (uint)method._M_t.
                 super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                 .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>._M_head_impl + 1) {
    (*(service->super_CommentHolder)._vptr_CommentHolder[9])
              (&local_170,service,
               (ulong)(uint)method._M_t.
                            super___uniq_ptr_impl<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_grpc_generator::Method_*,_std::default_delete<const_grpc_generator::Method>_>
                            .super__Head_base<0UL,_const_grpc_generator::Method_*,_false>.
                            _M_head_impl);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_170);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xb])(&local_1b0);
    JavaClassName(&local_190,vars,&local_1b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"input_type",&local_1d1)
    ;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_1d0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_170);
    (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0xd])(&local_218);
    JavaClassName(&local_1f8,vars,&local_218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"output_type",&local_239);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_238);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    p_Var6 = (_anonymous_namespace_ *)
             std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator*(&local_170);
    (anonymous_namespace)::LowerMethodName_abi_cxx11_(&local_260,p_Var6,method_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"lower_method_name",&local_281);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_280);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string((string *)&local_260);
    p_Var6 = (_anonymous_namespace_ *)
             std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator*(&local_170);
    (anonymous_namespace)::MethodPropertiesGetterName_abi_cxx11_(&local_2a8,p_Var6,method_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2c8,"method_method_name",&local_2c9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,(key_type *)local_2c8);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    std::__cxx11::string::~string((string *)&local_2a8);
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_170);
    uVar2 = (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0x10])();
    local_6d1 = 1;
    if ((uVar2 & 1) == 0) {
      pMVar5 = std::
               unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
               ::operator->(&local_170);
      iVar1 = (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0x12])();
      local_6d1 = (byte)iVar1;
    }
    local_2ca = local_6d1 & 1;
    pMVar5 = std::
             unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
             ::operator->(&local_170);
    uVar2 = (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0x11])();
    local_6d4 = 1;
    if ((uVar2 & 1) == 0) {
      pMVar5 = std::
               unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
               ::operator->(&local_170);
      iVar1 = (*(pMVar5->super_CommentHolder)._vptr_CommentHolder[0x12])();
      local_6d4 = (byte)iVar1;
    }
    local_2cb = local_6d4 & 1;
    if ((local_10c == 1) && ((local_2ca & 1) != 0)) {
      local_2d0 = 5;
    }
    else if ((local_10c == 2) && (((local_2ca & 1) != 0 || (local_2cb != 0)))) {
      local_2d0 = 5;
    }
    else {
      (*p->_vptr_Printer[3])(p,"\n");
      if ((local_10e & 1) == 0) {
        method_00 = std::
                    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>
                    ::operator*(&local_170);
        GrpcWriteMethodDocComment(p,vars,method_00);
      }
      (*p->_vptr_Printer[3])(p,"public ");
      if (local_10c == 0) {
        if ((local_2ca & 1) == 0) {
          (*p->_vptr_Printer[2])
                    (p,vars,
                     "void $lower_method_name$($input_type$ request,\n    $StreamObserver$<$output_type$> responseObserver)"
                    );
        }
        else {
          (*p->_vptr_Printer[2])
                    (p,vars,
                     "$StreamObserver$<$input_type$> $lower_method_name$(\n    $StreamObserver$<$output_type$> responseObserver)"
                    );
        }
      }
      else if (local_10c == 1) {
        local_2e1 = 0;
        if ((local_2ca & 1) != 0) {
          LogMessageVoidify::LogMessageVoidify(&local_2d1);
          LogHelper::LogHelper(&local_2e0,(ostream *)&std::cerr);
          local_2e1 = 1;
          poVar4 = LogHelper::get_os(&local_2e0);
          poVar4 = std::operator<<(poVar4,"CHECK FAILED: ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/grpc/src/compiler/java_generator.cc"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x232);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,
                                   "Blocking client interface with client streaming is unavailable")
          ;
          LogMessageVoidify::operator&(&local_2d1,poVar4);
        }
        if ((local_2e1 & 1) != 0) {
          LogHelper::~LogHelper(&local_2e0);
        }
        if ((local_2cb & 1) == 0) {
          (*p->_vptr_Printer[2])(p,vars,"$output_type$ $lower_method_name$($input_type$ request)");
        }
        else {
          (*p->_vptr_Printer[2])
                    (p,vars,
                     "$Iterator$<$output_type$> $lower_method_name$(\n    $input_type$ request)");
        }
      }
      else if (local_10c == 2) {
        local_2f1 = 0;
        if (((local_2ca & 1) != 0) || ((local_2cb & 1) != 0)) {
          LogMessageVoidify::LogMessageVoidify(&local_2e2);
          LogHelper::LogHelper(&local_2f0,(ostream *)&std::cerr);
          local_2f1 = 1;
          poVar4 = LogHelper::get_os(&local_2f0);
          poVar4 = std::operator<<(poVar4,"CHECK FAILED: ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/grpc/src/compiler/java_generator.cc"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x24d);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,"Future interface doesn\'t support streaming. ");
          poVar4 = std::operator<<(poVar4,"client_streaming=");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_2ca & 1));
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,"server_streaming=");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_2cb & 1));
          LogMessageVoidify::operator&(&local_2e2,poVar4);
        }
        if ((local_2f1 & 1) != 0) {
          LogHelper::~LogHelper(&local_2f0);
        }
        (*p->_vptr_Printer[2])
                  (p,vars,
                   "$ListenableFuture$<$output_type$> $lower_method_name$(\n    $input_type$ request)"
                  );
      }
      if ((local_10e & 1) == 0) {
        (*p->_vptr_Printer[3])(p," {\n");
        (*p->_vptr_Printer[5])();
        if ((local_10d & 1) == 0) {
          if ((local_10e & 1) == 0) {
            if (local_10c == 0) {
              if ((local_2cb & 1) == 0) {
                if ((local_2ca & 1) == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_4b8,"calls_method",&local_4b9);
                  pmVar3 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](vars,&local_4b8);
                  std::__cxx11::string::operator=((string *)pmVar3,"asyncUnaryCall");
                  std::__cxx11::string::~string((string *)&local_4b8);
                  std::allocator<char>::~allocator(&local_4b9);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_4e0,"params",&local_4e1);
                  pmVar3 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](vars,&local_4e0);
                  std::__cxx11::string::operator=((string *)pmVar3,"request, responseObserver");
                  std::__cxx11::string::~string((string *)&local_4e0);
                  std::allocator<char>::~allocator(&local_4e1);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_468,"calls_method",&local_469);
                  pmVar3 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](vars,&local_468);
                  std::__cxx11::string::operator=((string *)pmVar3,"asyncClientStreamingCall");
                  std::__cxx11::string::~string((string *)&local_468);
                  std::allocator<char>::~allocator(&local_469);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_490,"params",&local_491);
                  pmVar3 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](vars,&local_490);
                  std::__cxx11::string::operator=((string *)pmVar3,"responseObserver");
                  std::__cxx11::string::~string((string *)&local_490);
                  std::allocator<char>::~allocator(&local_491);
                }
              }
              else if ((local_2ca & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_418,"calls_method",&local_419);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](vars,&local_418);
                std::__cxx11::string::operator=((string *)pmVar3,"asyncServerStreamingCall");
                std::__cxx11::string::~string((string *)&local_418);
                std::allocator<char>::~allocator(&local_419);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_440,"params",&local_441);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](vars,&local_440);
                std::__cxx11::string::operator=((string *)pmVar3,"request, responseObserver");
                std::__cxx11::string::~string((string *)&local_440);
                std::allocator<char>::~allocator(&local_441);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3c8,"calls_method",&local_3c9);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](vars,&local_3c8);
                std::__cxx11::string::operator=((string *)pmVar3,"asyncBidiStreamingCall");
                std::__cxx11::string::~string((string *)&local_3c8);
                std::allocator<char>::~allocator(&local_3c9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3f0,"params",&local_3f1);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](vars,&local_3f0);
                std::__cxx11::string::operator=((string *)pmVar3,"responseObserver");
                std::__cxx11::string::~string((string *)&local_3f0);
                std::allocator<char>::~allocator(&local_3f1);
              }
              pcVar7 = "";
              if ((local_2ca & 1) != 0) {
                pcVar7 = "return ";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_508,"last_line_prefix",&local_509);
              pmVar3 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_508);
              std::__cxx11::string::operator=((string *)pmVar3,pcVar7);
              std::__cxx11::string::~string((string *)&local_508);
              std::allocator<char>::~allocator(&local_509);
              (*p->_vptr_Printer[2])
                        (p,vars,
                         "$last_line_prefix$$calls_method$(\n    getChannel().newCall($method_method_name$(), getCallOptions()), $params$);\n"
                        );
            }
            else if (local_10c == 1) {
              local_301 = 0;
              if ((local_2ca & 1) != 0) {
                LogMessageVoidify::LogMessageVoidify(&local_2f2);
                LogHelper::LogHelper(&local_300,(ostream *)&std::cerr);
                local_301 = 1;
                poVar4 = LogHelper::get_os(&local_300);
                poVar4 = std::operator<<(poVar4,"CHECK FAILED: ");
                poVar4 = std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/grpc/src/compiler/java_generator.cc"
                                        );
                poVar4 = std::operator<<(poVar4,":");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x274);
                poVar4 = std::operator<<(poVar4,": ");
                poVar4 = std::operator<<(poVar4,
                                         "Blocking client streaming interface is not available");
                LogMessageVoidify::operator&(&local_2f2,poVar4);
              }
              if ((local_301 & 1) != 0) {
                LogHelper::~LogHelper(&local_300);
              }
              if ((local_2cb & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_378,"calls_method",&local_379);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](vars,&local_378);
                std::__cxx11::string::operator=((string *)pmVar3,"blockingUnaryCall");
                std::__cxx11::string::~string((string *)&local_378);
                std::allocator<char>::~allocator(&local_379);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3a0,"params",&local_3a1);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](vars,&local_3a0);
                std::__cxx11::string::operator=((string *)pmVar3,"request");
                std::__cxx11::string::~string((string *)&local_3a0);
                std::allocator<char>::~allocator(&local_3a1);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_328,"calls_method",&local_329);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](vars,&local_328);
                std::__cxx11::string::operator=((string *)pmVar3,"blockingServerStreamingCall");
                std::__cxx11::string::~string((string *)&local_328);
                std::allocator<char>::~allocator(&local_329);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_350,"params",&local_351);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](vars,&local_350);
                std::__cxx11::string::operator=((string *)pmVar3,"request");
                std::__cxx11::string::~string((string *)&local_350);
                std::allocator<char>::~allocator(&local_351);
              }
              (*p->_vptr_Printer[2])
                        (p,vars,
                         "return $calls_method$(\n    getChannel(), $method_method_name$(), getCallOptions(), $params$);\n"
                        );
            }
            else if (local_10c == 2) {
              local_519 = 0;
              if (((local_2ca & 1) != 0) || ((local_2cb & 1) != 0)) {
                LogMessageVoidify::LogMessageVoidify(&local_50a);
                LogHelper::LogHelper(&local_518,(ostream *)&std::cerr);
                local_519 = 1;
                poVar4 = LogHelper::get_os(&local_518);
                poVar4 = std::operator<<(poVar4,"CHECK FAILED: ");
                poVar4 = std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/grpc/src/compiler/java_generator.cc"
                                        );
                poVar4 = std::operator<<(poVar4,":");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x29b);
                poVar4 = std::operator<<(poVar4,": ");
                poVar4 = std::operator<<(poVar4,"Future interface doesn\'t support streaming. ");
                poVar4 = std::operator<<(poVar4,"client_streaming=");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_2ca & 1));
                poVar4 = std::operator<<(poVar4,", ");
                poVar4 = std::operator<<(poVar4,"server_streaming=");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_2cb & 1));
                LogMessageVoidify::operator&(&local_50a,poVar4);
              }
              if ((local_519 & 1) != 0) {
                LogHelper::~LogHelper(&local_518);
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_540,"calls_method",&local_541);
              pmVar3 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_540);
              std::__cxx11::string::operator=((string *)pmVar3,"futureUnaryCall");
              std::__cxx11::string::~string((string *)&local_540);
              std::allocator<char>::~allocator(&local_541);
              (*p->_vptr_Printer[2])
                        (p,vars,
                         "return $calls_method$(\n    getChannel().newCall($method_method_name$(), getCallOptions()), request);\n"
                        );
            }
          }
        }
        else if (local_10c == 0) {
          if ((local_2ca & 1) == 0) {
            (*p->_vptr_Printer[2])
                      (p,vars,
                       "asyncUnimplementedUnaryCall($method_method_name$(), responseObserver);\n");
          }
          else {
            (*p->_vptr_Printer[2])
                      (p,vars,
                       "return asyncUnimplementedStreamingCall($method_method_name$(), responseObserver);\n"
                      );
          }
        }
        (*p->_vptr_Printer[6])();
        (*p->_vptr_Printer[3])(p,"}\n");
        local_2d0 = 0;
      }
      else {
        (*p->_vptr_Printer[3])(p,";\n");
        local_2d0 = 5;
      }
    }
    std::
    unique_ptr<const_grpc_generator::Method,_std::default_delete<const_grpc_generator::Method>_>::
    ~unique_ptr(&local_170);
  }
  if ((local_10d & 1) != 0) {
    (*p->_vptr_Printer[3])(p,"\n");
    (*p->_vptr_Printer[2])
              (p,vars,"@$Override$ public final $ServerServiceDefinition$ bindService() {\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"instance",&local_569);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_568);
    std::__cxx11::string::operator=((string *)pmVar3,"this");
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    PrintBindServiceMethodBody(p,vars,service);
    (*p->_vptr_Printer[3])(p,"}\n");
  }
  (*p->_vptr_Printer[6])();
  (*p->_vptr_Printer[3])(p,"}\n\n");
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string((string *)(client_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

static void PrintStub(Printer *p, VARS &vars, const ServiceDescriptor *service,
                      StubType type) {
  const string service_name = service->name();
  vars["service_name"] = service_name;
  vars["abstract_name"] = service_name + "ImplBase";
  string stub_name = service_name;
  string client_name = service_name;
  CallType call_type = ASYNC_CALL;
  bool impl_base = false;
  bool interface = false;
  switch (type) {
    case ABSTRACT_CLASS:
      call_type = ASYNC_CALL;
      impl_base = true;
      break;
    case ASYNC_CLIENT_IMPL:
      call_type = ASYNC_CALL;
      stub_name += "Stub";
      break;
    case BLOCKING_CLIENT_INTERFACE:
      interface = true;
      FLATBUFFERS_FALLTHROUGH();  // fall thru
    case BLOCKING_CLIENT_IMPL:
      call_type = BLOCKING_CALL;
      stub_name += "BlockingStub";
      client_name += "BlockingClient";
      break;
    case FUTURE_CLIENT_INTERFACE:
      interface = true;
      FLATBUFFERS_FALLTHROUGH();  // fall thru
    case FUTURE_CLIENT_IMPL:
      call_type = FUTURE_CALL;
      stub_name += "FutureStub";
      client_name += "FutureClient";
      break;
    case ASYNC_INTERFACE:
      call_type = ASYNC_CALL;
      interface = true;
      break;
    default:
      GRPC_CODEGEN_FAIL << "Cannot determine class name for StubType: " << type;
  }
  vars["stub_name"] = stub_name;
  vars["client_name"] = client_name;

  // Class head
  if (!interface) { GrpcWriteServiceDocComment(p, vars, service); }
  if (impl_base) {
    p->Print(vars,
             "public static abstract class $abstract_name$ implements "
             "$BindableService$ {\n");
  } else {
    p->Print(vars,
             "public static final class $stub_name$ extends "
             "$AbstractStub$<$stub_name$> {\n");
  }
  p->Indent();

  // Constructor and build() method
  if (!impl_base && !interface) {
    p->Print(vars, "private $stub_name$($Channel$ channel) {\n");
    p->Indent();
    p->Print("super(channel);\n");
    p->Outdent();
    p->Print("}\n\n");
    p->Print(vars,
             "private $stub_name$($Channel$ channel,\n"
             "    $CallOptions$ callOptions) {\n");
    p->Indent();
    p->Print("super(channel, callOptions);\n");
    p->Outdent();
    p->Print("}\n\n");
    p->Print(vars,
             "@$Override$\n"
             "protected $stub_name$ build($Channel$ channel,\n"
             "    $CallOptions$ callOptions) {\n");
    p->Indent();
    p->Print(vars, "return new $stub_name$(channel, callOptions);\n");
    p->Outdent();
    p->Print("}\n");
  }

  // RPC methods
  for (int i = 0; i < service->method_count(); ++i) {
    auto method = service->method(i);
    vars["input_type"] = JavaClassName(vars, method->get_input_type_name());
    vars["output_type"] = JavaClassName(vars, method->get_output_type_name());
    vars["lower_method_name"] = LowerMethodName(&*method);
    vars["method_method_name"] = MethodPropertiesGetterName(&*method);
    bool client_streaming =
        method->ClientStreaming() || method->BidiStreaming();
    bool server_streaming =
        method->ServerStreaming() || method->BidiStreaming();

    if (call_type == BLOCKING_CALL && client_streaming) {
      // Blocking client interface with client streaming is not available
      continue;
    }

    if (call_type == FUTURE_CALL && (client_streaming || server_streaming)) {
      // Future interface doesn't support streaming.
      continue;
    }

    // Method signature
    p->Print("\n");
    // TODO(nmittler): Replace with WriteMethodDocComment once included by the
    // protobuf distro.
    if (!interface) { GrpcWriteMethodDocComment(p, vars, &*method); }
    p->Print("public ");
    switch (call_type) {
      case BLOCKING_CALL:
        GRPC_CODEGEN_CHECK(!client_streaming)
            << "Blocking client interface with client streaming is unavailable";
        if (server_streaming) {
          // Server streaming
          p->Print(vars,
                   "$Iterator$<$output_type$> $lower_method_name$(\n"
                   "    $input_type$ request)");
        } else {
          // Simple RPC
          p->Print(vars,
                   "$output_type$ $lower_method_name$($input_type$ request)");
        }
        break;
      case ASYNC_CALL:
        if (client_streaming) {
          // Bidirectional streaming or client streaming
          p->Print(vars,
                   "$StreamObserver$<$input_type$> $lower_method_name$(\n"
                   "    $StreamObserver$<$output_type$> responseObserver)");
        } else {
          // Server streaming or simple RPC
          p->Print(vars,
                   "void $lower_method_name$($input_type$ request,\n"
                   "    $StreamObserver$<$output_type$> responseObserver)");
        }
        break;
      case FUTURE_CALL:
        GRPC_CODEGEN_CHECK(!client_streaming && !server_streaming)
            << "Future interface doesn't support streaming. "
            << "client_streaming=" << client_streaming << ", "
            << "server_streaming=" << server_streaming;
        p->Print(vars,
                 "$ListenableFuture$<$output_type$> $lower_method_name$(\n"
                 "    $input_type$ request)");
        break;
    }

    if (interface) {
      p->Print(";\n");
      continue;
    }
    // Method body.
    p->Print(" {\n");
    p->Indent();
    if (impl_base) {
      switch (call_type) {
          // NB: Skipping validation of service methods. If something is wrong,
          // we wouldn't get to this point as compiler would return errors when
          // generating service interface.
        case ASYNC_CALL:
          if (client_streaming) {
            p->Print(vars,
                     "return "
                     "asyncUnimplementedStreamingCall($method_method_name$(), "
                     "responseObserver);\n");
          } else {
            p->Print(vars,
                     "asyncUnimplementedUnaryCall($method_method_name$(), "
                     "responseObserver);\n");
          }
          break;
        default: break;
      }
    } else if (!interface) {
      switch (call_type) {
        case BLOCKING_CALL:
          GRPC_CODEGEN_CHECK(!client_streaming)
              << "Blocking client streaming interface is not available";
          if (server_streaming) {
            vars["calls_method"] = "blockingServerStreamingCall";
            vars["params"] = "request";
          } else {
            vars["calls_method"] = "blockingUnaryCall";
            vars["params"] = "request";
          }
          p->Print(vars,
                   "return $calls_method$(\n"
                   "    getChannel(), $method_method_name$(), "
                   "getCallOptions(), $params$);\n");
          break;
        case ASYNC_CALL:
          if (server_streaming) {
            if (client_streaming) {
              vars["calls_method"] = "asyncBidiStreamingCall";
              vars["params"] = "responseObserver";
            } else {
              vars["calls_method"] = "asyncServerStreamingCall";
              vars["params"] = "request, responseObserver";
            }
          } else {
            if (client_streaming) {
              vars["calls_method"] = "asyncClientStreamingCall";
              vars["params"] = "responseObserver";
            } else {
              vars["calls_method"] = "asyncUnaryCall";
              vars["params"] = "request, responseObserver";
            }
          }
          vars["last_line_prefix"] = client_streaming ? "return " : "";
          p->Print(vars,
                   "$last_line_prefix$$calls_method$(\n"
                   "    getChannel().newCall($method_method_name$(), "
                   "getCallOptions()), $params$);\n");
          break;
        case FUTURE_CALL:
          GRPC_CODEGEN_CHECK(!client_streaming && !server_streaming)
              << "Future interface doesn't support streaming. "
              << "client_streaming=" << client_streaming << ", "
              << "server_streaming=" << server_streaming;
          vars["calls_method"] = "futureUnaryCall";
          p->Print(vars,
                   "return $calls_method$(\n"
                   "    getChannel().newCall($method_method_name$(), "
                   "getCallOptions()), request);\n");
          break;
      }
    }
    p->Outdent();
    p->Print("}\n");
  }

  if (impl_base) {
    p->Print("\n");
    p->Print(
        vars,
        "@$Override$ public final $ServerServiceDefinition$ bindService() {\n");
    vars["instance"] = "this";
    PrintBindServiceMethodBody(p, vars, service);
    p->Print("}\n");
  }

  p->Outdent();
  p->Print("}\n\n");
}